

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

Uint64 __thiscall
Diligent::CommandQueueVkImpl::SubmitCmdBuffer(CommandQueueVkImpl *this,VkCommandBuffer cmdBuffer)

{
  Uint64 UVar1;
  undefined1 local_60 [8];
  VkSubmitInfo SubmitInfo;
  VkCommandBuffer cmdBuffer_local;
  CommandQueueVkImpl *this_local;
  
  SubmitInfo.pSignalSemaphores = (VkSemaphore *)cmdBuffer;
  memset(local_60,0,0x48);
  local_60._0_4_ = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  SubmitInfo.pWaitDstStageMask._0_4_ = (uint)(SubmitInfo.pSignalSemaphores != (VkSemaphore *)0x0);
  SubmitInfo._40_8_ = &SubmitInfo.pSignalSemaphores;
  SubmitInfo.pNext._0_4_ = 0;
  SubmitInfo.waitSemaphoreCount = 0;
  SubmitInfo._20_4_ = 0;
  SubmitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  SubmitInfo.pCommandBuffers._0_4_ = 0;
  SubmitInfo.signalSemaphoreCount = 0;
  SubmitInfo._60_4_ = 0;
  UVar1 = Submit(this,(VkSubmitInfo *)local_60);
  return UVar1;
}

Assistant:

Uint64 CommandQueueVkImpl::SubmitCmdBuffer(VkCommandBuffer cmdBuffer)
{
    VkSubmitInfo SubmitInfo{};
    SubmitInfo.sType              = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    SubmitInfo.commandBufferCount = cmdBuffer != VK_NULL_HANDLE ? 1 : 0;
    SubmitInfo.pCommandBuffers    = &cmdBuffer;
    SubmitInfo.waitSemaphoreCount = 0;       // the number of semaphores upon which to wait before executing the command buffers
    SubmitInfo.pWaitSemaphores    = nullptr; // a pointer to an array of semaphores upon which to wait before the command
                                             // buffers begin execution
    SubmitInfo.pWaitDstStageMask = nullptr;  // a pointer to an array of pipeline stages at which each corresponding
                                             // semaphore wait will occur
    SubmitInfo.signalSemaphoreCount = 0;     // the number of semaphores to be signaled once the commands specified in
                                             // pCommandBuffers have completed execution
    SubmitInfo.pSignalSemaphores = nullptr;  // a pointer to an array of semaphores which will be signaled when the
                                             // command buffers for this batch have completed execution

    return Submit(SubmitInfo);
}